

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O1

int __thiscall AliHttpRequest::CommitRequestWithBody(AliHttpRequest *this,string *body)

{
  int iVar1;
  mapped_type *pmVar2;
  key_type local_58;
  string local_38;
  
  iVar1 = std::__cxx11::string::compare((char *)&this->method_);
  if (iVar1 == 0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Content-Length","");
    get_format_string_abi_cxx11_(&local_38,"%d",body->_M_string_length);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->map_request_headers_,&local_58);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  (**this->_vptr_AliHttpRequest)(this);
  if (body->_M_string_length != 0) {
    (*this->connection_->_vptr_AliConnection[1])(this->connection_,(body->_M_dataplus)._M_p);
  }
  return 0;
}

Assistant:

int AliHttpRequest::CommitRequestWithBody(const std::string& body) {
  // todo:check body size
  int ret = 0;

  if(this->method_ == "POST") {
    this->AddRequestHeader("Content-Length", get_format_string("%d", body.size()));
  }
  
  ret = this->CommitRequest();

  if(body.size()) {
    this->connection_->Send((char*)body.c_str(), body.size());
  }
  
  return 0;
}